

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_ptr_queue.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::schedule
          (mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *this,
          agent_queue_t *queue)

{
  type __m;
  lock_guard<so_5::disp::mpmc_queue_traits::lock_t> local_20;
  lock_guard<so_5::disp::mpmc_queue_traits::lock_t> lock;
  agent_queue_t *queue_local;
  mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *this_local;
  
  lock._M_device = (mutex_type *)queue;
  __m = std::
        unique_ptr<so_5::disp::mpmc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
        ::operator*(&this->m_lock);
  std::lock_guard<so_5::disp::mpmc_queue_traits::lock_t>::lock_guard(&local_20,__m);
  std::
  deque<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
  ::push_back(&this->m_queue,(value_type *)&lock);
  try_wakeup_someone_if_possible(this);
  std::lock_guard<so_5::disp::mpmc_queue_traits::lock_t>::~lock_guard(&local_20);
  return;
}

Assistant:

void
		schedule( T * queue )
			{
				std::lock_guard< so_5::disp::mpmc_queue_traits::lock_t > lock{ *m_lock };

				m_queue.push_back( queue );

				try_wakeup_someone_if_possible();
			}